

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O2

LispPTR * N_OP_dunbind(LispPTR *stack_pointer,LispPTR tos)

{
  uint uVar1;
  undefined4 *puVar2;
  ushort uVar3;
  
  if ((int)tos < 0) {
    if (tos < 0xffff0000) {
      puVar2 = (undefined4 *)((ulong)((tos & 0xffff) * 2) + (long)MachineState.pvar);
      for (uVar3 = 0; uVar3 < (ushort)~(ushort)(tos >> 0x10); uVar3 = uVar3 + 1) {
        *puVar2 = 0xffffffff;
        puVar2 = puVar2 + -1;
      }
    }
  }
  else {
    do {
      uVar1 = stack_pointer[-1];
      stack_pointer = stack_pointer + -1;
    } while (-1 < (int)uVar1);
    puVar2 = (undefined4 *)((ulong)((uVar1 & 0xffff) * 2) + (long)MachineState.pvar);
    for (uVar3 = 0; uVar3 < (ushort)~(ushort)(uVar1 >> 0x10); uVar3 = uVar3 + 1) {
      *puVar2 = 0xffffffff;
      puVar2 = puVar2 + -1;
    }
  }
  return stack_pointer;
}

Assistant:

LispPTR *N_OP_dunbind(LispPTR *stack_pointer, LispPTR tos) {
  DLword num;     /* number of unbind sot */
  LispPTR *ppvar; /* pointer to last PVAR slot. */
  DLword i;       /* temporary for control */
  LispPTR value;

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_dunbind()\n");
#endif

  if (tos & 0x80000000) {
    /* check MSB bit of High word in tos, 1: unbound, 0: bound */

    /* tos is unbound */
    num = ~(GetHiWord(tos));
    value = 0xffffffff;
    if (num != 0) {
      ppvar = (LispPTR *)(PVar + 2 + GetLoWord(tos));
      for (i = 0; i < num; ++i) { *--ppvar = value; }
    }
  } else {
    /* tos is bound */
    /* now, stack_pointer points the latter part in slot */
    for (; !((*--stack_pointer) & 0x80000000);)
      ;
    /* scan (until MSB == 1) */

    value = *stack_pointer;
    num = ~(GetHiWord(value));
    ppvar = (LispPTR *)(PVar + 2 + GetLoWord(value));
    value = 0xffffffff;
    for (i = 0; i < num; i++) { *--ppvar = value; }
  }

  return (stack_pointer);
}